

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

char * al_get_first_config_entry
                 (ALLEGRO_CONFIG *config,char *section,ALLEGRO_CONFIG_ENTRY **iterator)

{
  ALLEGRO_USTR *key;
  void *pvVar1;
  ALLEGRO_CONFIG_ENTRY *pAVar2;
  char *pcVar3;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR_INFO local_20;
  
  if (config == (ALLEGRO_CONFIG *)0x0) {
    return (char *)0x0;
  }
  pcVar3 = "";
  if (section != (char *)0x0) {
    pcVar3 = section;
  }
  key = al_ref_cstr(&local_20,pcVar3);
  pvVar1 = _al_aa_search((Aatree *)config->tree,key,cmp_ustr);
  if (pvVar1 != (void *)0x0) {
    for (pAVar2 = *(ALLEGRO_CONFIG_ENTRY **)((long)pvVar1 + 8);
        (pAVar2 != (ALLEGRO_CONFIG_ENTRY *)0x0 && (pAVar2->is_comment == true));
        pAVar2 = pAVar2->next) {
    }
    if (iterator != (ALLEGRO_CONFIG_ENTRY **)0x0) {
      *iterator = pAVar2;
    }
    if (pAVar2 != (ALLEGRO_CONFIG_ENTRY *)0x0) {
      pcVar3 = al_cstr(pAVar2->key);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *al_get_first_config_entry(ALLEGRO_CONFIG const *config,
   char const *section, ALLEGRO_CONFIG_ENTRY **iterator)
{
   ALLEGRO_USTR_INFO section_info;
   const ALLEGRO_USTR *usection;
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *e;

   if (!config)
      return NULL;

   if (section == NULL)
      section = "";

   usection = al_ref_cstr(&section_info, section);
   s = find_section(config, usection);
   if (!s)
      return NULL;
   e = s->head;
   while (e && e->is_comment)
      e = e->next;
   if (iterator) *iterator = e;
   return e ? al_cstr(e->key) : NULL;
}